

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_endpoint.hpp
# Opt level: O1

void __thiscall
websocketpp::server<websocketpp::config::asio>::start_accept
          (server<websocketpp::config::asio> *this,error_code *ec)

{
  error_category *peVar1;
  undefined8 *puVar2;
  connection_ptr con;
  _Any_data local_88;
  transport_con_ptr local_78;
  accept_handler local_68;
  connection<websocketpp::config::asio> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  error_code local_30;
  
  if ((this->
      super_endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>)
      .super_transport_type.m_state == LISTENING) {
    peVar1 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar1;
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::
    create_connection((endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                       *)&local_88);
    if ((connection<websocketpp::config::asio> *)local_88._M_unused._0_8_ ==
        (connection<websocketpp::config::asio> *)0x0) {
      if (error::get_category()::instance == '\0') {
        start_accept();
      }
      ec->_M_value = 0x11;
      ec->_M_cat = (error_category *)&error::get_category()::instance;
    }
    else {
      local_78.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_88._M_unused._0_8_;
      local_78.
      super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
        }
      }
      local_48 = (connection<websocketpp::config::asio> *)local_88._M_unused._0_8_;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
        }
      }
      local_68 = (accept_handler)(ZEXT832(0) << 0x20);
      puVar2 = (undefined8 *)operator_new(0x28);
      *puVar2 = handle_accept;
      puVar2[1] = 0;
      puVar2[2] = local_48;
      puVar2[3] = p_Stack_40;
      puVar2[4] = this;
      local_68.super__Function_base._M_functor._M_unused._M_object = puVar2;
      local_68.super__Function_base._M_manager =
           std::
           _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>_>
           ::_M_manager;
      local_68._M_invoker =
           std::
           _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::server<websocketpp::config::asio>::*(websocketpp::server<websocketpp::config::asio>_*,_std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_const_std::error_code_&)>_>
           ::_M_invoke;
      transport::asio::endpoint<websocketpp::config::asio::transport_config>::async_accept
                ((endpoint<websocketpp::config::asio::transport_config> *)this,&local_78,&local_68,
                 ec);
      if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.super__Function_base._M_manager)
                  ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
      }
      if (local_78.
          super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((ec->_M_value != 0) &&
         ((connection<websocketpp::config::asio> *)local_88._M_unused._0_8_ !=
          (connection<websocketpp::config::asio> *)0x0)) {
        local_30._M_value = 0;
        local_30._M_cat = peVar1;
        connection<websocketpp::config::asio>::terminate
                  ((connection<websocketpp::config::asio> *)local_88._M_unused._0_8_,&local_30);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  }
  else {
    if (error::get_category()::instance == '\0') {
      start_accept();
    }
    ec->_M_value = 0x19;
    ec->_M_cat = (error_category *)&error::get_category()::instance;
  }
  return;
}

Assistant:

void start_accept(lib::error_code & ec) {
        if (!transport_type::is_listening()) {
            ec = error::make_error_code(error::async_accept_not_listening);
            return;
        }
        
        ec = lib::error_code();
        connection_ptr con = get_connection();

        if (!con) {
          ec = error::make_error_code(error::con_creation_failed);
          return;
        }

        transport_type::async_accept(
            lib::static_pointer_cast<transport_con_type>(con),
            lib::bind(&type::handle_accept,this,con,lib::placeholders::_1),
            ec
        );

        if (ec && con) {
            // If the connection was constructed but the accept failed,
            // terminate the connection to prevent memory leaks
            con->terminate(lib::error_code());
        }
    }